

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::JunitReporter::writeTestCase(JunitReporter *this,TestCaseNode *testCaseNode)

{
  pointer pPVar1;
  SectionNode *sectionNode;
  pointer pcVar2;
  string local_68;
  undefined1 local_48 [8];
  string className;
  
  pPVar1 = (testCaseNode->children).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(testCaseNode->children).
            super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 == 8) {
    sectionNode = pPVar1->m_p;
    pcVar2 = (testCaseNode->value).testInfo.className._M_dataplus._M_p;
    local_48 = (undefined1  [8])&className._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar2,
               pcVar2 + (testCaseNode->value).testInfo.className._M_string_length);
    if ((className._M_dataplus._M_p == (pointer)0x0) &&
       ((sectionNode->childSections).
        super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (sectionNode->childSections).
        super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      std::__cxx11::string::_M_replace((ulong)local_48,0,(char *)0x0,0x18ea99);
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    writeSection(this,(string *)local_48,&local_68,sectionNode);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_48 != (undefined1  [8])&className._M_string_length) {
      operator_delete((void *)local_48,className._M_string_length + 1);
    }
    return;
  }
  __assert_fail("testCaseNode.children.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sasq64[P]fastzip/src/catch.hpp"
                ,0x24c8,"void Catch::JunitReporter::writeTestCase(const TestCaseNode &)");
}

Assistant:

void writeTestCase( TestCaseNode const& testCaseNode ) {
            TestCaseStats const& stats = testCaseNode.value;

            // All test cases have exactly one section - which represents the
            // test case itself. That section may have 0-n nested sections
            assert( testCaseNode.children.size() == 1 );
            SectionNode const& rootSection = *testCaseNode.children.front();

            std::string className = stats.testInfo.className;

            if( className.empty() ) {
                if( rootSection.childSections.empty() )
                    className = "global";
            }
            writeSection( className, "", rootSection );
        }